

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  basic_string_view<char> sep;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_RSI;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_RDI;
  add_thousands_sep<char> in_stack_00000010;
  basic_string_view<char> s;
  add_thousands_sep<char> local_58;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_40;
  ostream_type *local_30;
  char *local_28;
  char *local_20;
  undefined4 local_18;
  int in_stack_ffffffffffffffec;
  
  basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)&local_20,(char *)((long)&in_RDI->_M_string + 4),1);
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(&local_40,in_RSI);
  sep.size_._4_4_ = in_stack_ffffffffffffffec;
  sep.size_._0_4_ = local_18;
  sep.data_ = local_20;
  internal::add_thousands_sep<char>::add_thousands_sep(&local_58,sep);
  internal::
  format_decimal<char,unsigned_long,std::ostream_iterator<char,char,std::char_traits<char>>,fmt::v5::internal::add_thousands_sep<char>>
            (in_RDI,(unsigned_long)in_RSI,in_stack_ffffffffffffffec,in_stack_00000010);
  in_RSI->_M_stream = local_30;
  in_RSI->_M_string = local_28;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }